

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_opengl.c
# Opt level: O3

void impl_GLSL_FinalInitProgram(MOJOSHADER_glProgram *program)

{
  GLint GVar1;
  PFNGLGETUNIFORMLOCATIONPROC *pp_Var2;
  PFNGLGETUNIFORMLOCATIONARBPROC *pp_Var3;
  
  pp_Var2 = &ctx->glGetUniformLocation;
  if (ctx->have_opengl_2 == 0) {
    pp_Var2 = (PFNGLGETUNIFORMLOCATIONPROC *)&ctx->glGetUniformLocationARB;
  }
  GVar1 = (**pp_Var2)(program->handle,"vs_uniforms_vec4");
  program->vs_float4_loc = GVar1;
  pp_Var2 = &ctx->glGetUniformLocation;
  if (ctx->have_opengl_2 == 0) {
    pp_Var2 = (PFNGLGETUNIFORMLOCATIONPROC *)&ctx->glGetUniformLocationARB;
  }
  GVar1 = (**pp_Var2)(program->handle,"vs_uniforms_ivec4");
  program->vs_int4_loc = GVar1;
  pp_Var2 = &ctx->glGetUniformLocation;
  if (ctx->have_opengl_2 == 0) {
    pp_Var2 = (PFNGLGETUNIFORMLOCATIONPROC *)&ctx->glGetUniformLocationARB;
  }
  GVar1 = (**pp_Var2)(program->handle,"vs_uniforms_bool");
  program->vs_bool_loc = GVar1;
  pp_Var2 = &ctx->glGetUniformLocation;
  if (ctx->have_opengl_2 == 0) {
    pp_Var2 = (PFNGLGETUNIFORMLOCATIONPROC *)&ctx->glGetUniformLocationARB;
  }
  GVar1 = (**pp_Var2)(program->handle,"ps_uniforms_vec4");
  program->ps_float4_loc = GVar1;
  pp_Var2 = &ctx->glGetUniformLocation;
  if (ctx->have_opengl_2 == 0) {
    pp_Var2 = (PFNGLGETUNIFORMLOCATIONPROC *)&ctx->glGetUniformLocationARB;
  }
  GVar1 = (**pp_Var2)(program->handle,"ps_uniforms_ivec4");
  program->ps_int4_loc = GVar1;
  pp_Var3 = &ctx->glGetUniformLocationARB;
  if (ctx->have_opengl_2 != 0) {
    pp_Var3 = (PFNGLGETUNIFORMLOCATIONARBPROC *)&ctx->glGetUniformLocation;
  }
  GVar1 = (**pp_Var3)(program->handle,"ps_uniforms_bool");
  program->ps_bool_loc = GVar1;
  return;
}

Assistant:

static void impl_GLSL_FinalInitProgram(MOJOSHADER_glProgram *program)
{
    
    program->vs_float4_loc = glsl_uniform_loc(program, "vs_uniforms_vec4");
    program->vs_int4_loc = glsl_uniform_loc(program, "vs_uniforms_ivec4");
    program->vs_bool_loc = glsl_uniform_loc(program, "vs_uniforms_bool");
    program->ps_float4_loc = glsl_uniform_loc(program, "ps_uniforms_vec4");
    program->ps_int4_loc = glsl_uniform_loc(program, "ps_uniforms_ivec4");
    program->ps_bool_loc = glsl_uniform_loc(program, "ps_uniforms_bool");
#ifdef MOJOSHADER_FLIP_RENDERTARGET
    program->vs_flip_loc = glsl_uniform_loc(program, "vpFlip");
#endif
}